

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

Stream * rw::ps2::writeMipmap(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  uint val;
  
  val = defaultMipMapKL;
  if (*object == 0) {
    val = (uint)*(ushort *)((long)nativeRasterOffset + 0xc);
  }
  Stream::writeI32(stream,val);
  return stream;
}

Assistant:

static Stream*
writeMipmap(Stream *stream, int32, void *object, int32 offset, int32)
{
	Texture *tex = (Texture*)object;
	if(tex->raster){
		stream->writeI32(defaultMipMapKL);
		return stream;
	}
	Ps2Raster *raster = GETPS2RASTEREXT(tex->raster);
	stream->writeI32(raster->kl);
	return stream;
}